

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestResultParser.cpp
# Opt level: O0

void __thiscall xe::TestResultParser::handleData(TestResultParser *this)

{
  bool bVar1;
  Item *this_00;
  size_type sVar2;
  TestResultParseError *pTVar3;
  byte *pbVar4;
  Type local_b4;
  deUint8 *outPtr;
  string local_98;
  value_type_conflict1 local_75;
  int local_74;
  undefined1 local_6d;
  int phase;
  allocator<char> local_59;
  string local_58;
  byte local_32;
  deUint8 local_31;
  int local_30;
  deUint8 decodedBits;
  int iStack_2c;
  deUint8 byte;
  int inNdx;
  int numBytesIn;
  Image *image;
  Item *pIStack_18;
  Type type;
  Item *curItem;
  TestResultParser *this_local;
  
  curItem = (Item *)this;
  pIStack_18 = getCurrentItem(this);
  if (pIStack_18 == (Item *)0x0) {
    local_b4 = TYPE_LAST;
  }
  else {
    local_b4 = ri::Item::getType(pIStack_18);
  }
  image._4_4_ = local_b4;
  switch(local_b4) {
  case TYPE_RESULT:
    xml::Parser::appendDataStr(&this->m_xmlParser,(string *)(pIStack_18 + 1));
    break;
  case TYPE_TEXT:
    xml::Parser::appendDataStr(&this->m_xmlParser,(string *)(pIStack_18 + 1));
    break;
  case TYPE_NUMBER:
  case TYPE_SAMPLEVALUE:
    xml::Parser::appendDataStr(&this->m_xmlParser,&this->m_curNumValue);
    break;
  case TYPE_IMAGE:
    _inNdx = pIStack_18;
    iStack_2c = xml::Parser::getDataSize(&this->m_xmlParser);
    for (local_30 = 0; local_30 < iStack_2c; local_30 = local_30 + 1) {
      local_31 = xml::Parser::getDataByte(&this->m_xmlParser,local_30);
      local_32 = 0;
      bVar1 = de::inRange<signed_char>(local_31,'A','Z');
      if (bVar1) {
        local_32 = local_31 + 0xbf;
LAB_0016f199:
        local_74 = this->m_base64DecodeOffset % 4;
        if (local_74 == 0) {
          this_00 = _inNdx + 6;
          sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(_inNdx + 6));
          local_75 = '\0';
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00,sVar2 + 3,
                     &local_75);
        }
        sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(_inNdx + 6));
        if ((int)sVar2 < (this->m_base64DecodeOffset >> 2) * 3 + 3) {
          outPtr._6_1_ = 1;
          pTVar3 = (TestResultParseError *)__cxa_allocate_exception(0x10);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_98,"Malformed base64 data",
                     (allocator<char> *)((long)&outPtr + 7));
          TestResultParseError::TestResultParseError(pTVar3,&local_98);
          outPtr._6_1_ = 0;
          __cxa_throw(pTVar3,&TestResultParseError::typeinfo,
                      TestResultParseError::~TestResultParseError);
        }
        pbVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(_inNdx + 6),
                            (long)((this->m_base64DecodeOffset >> 2) * 3));
        switch(local_74) {
        case 0:
          *pbVar4 = *pbVar4 | local_32 << 2;
          break;
        case 1:
          *pbVar4 = *pbVar4 | (byte)((int)(uint)local_32 >> 4);
          pbVar4[1] = pbVar4[1] | local_32 << 4;
          break;
        case 2:
          pbVar4[1] = pbVar4[1] | (byte)((int)(uint)local_32 >> 2);
          pbVar4[2] = pbVar4[2] | local_32 << 6;
          break;
        case 3:
          pbVar4[2] = pbVar4[2] | local_32;
        }
        this->m_base64DecodeOffset = this->m_base64DecodeOffset + 1;
      }
      else {
        bVar1 = de::inRange<signed_char>(local_31,'a','z');
        if (bVar1) {
          local_32 = local_31 + 0xb9;
          goto LAB_0016f199;
        }
        bVar1 = de::inRange<signed_char>(local_31,'0','9');
        if (bVar1) {
          local_32 = local_31 + 4;
          goto LAB_0016f199;
        }
        if (local_31 == '+') {
          local_32 = 0x3e;
          goto LAB_0016f199;
        }
        if (local_31 == '/') {
          local_32 = 0x3f;
          goto LAB_0016f199;
        }
        if (local_31 == '=') {
          bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(_inNdx + 6));
          if (bVar1) {
            local_6d = 1;
            pTVar3 = (TestResultParseError *)__cxa_allocate_exception(0x10);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_58,"Malformed base64 data",&local_59);
            TestResultParseError::TestResultParseError(pTVar3,&local_58);
            local_6d = 0;
            __cxa_throw(pTVar3,&TestResultParseError::typeinfo,
                        TestResultParseError::~TestResultParseError);
          }
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::pop_back
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(_inNdx + 6));
        }
      }
    }
    break;
  default:
    break;
  case TYPE_SHADERSOURCE:
    xml::Parser::appendDataStr(&this->m_xmlParser,(string *)(pIStack_18 + 1));
    break;
  case TYPE_SPIRVSOURCE:
    xml::Parser::appendDataStr(&this->m_xmlParser,(string *)(pIStack_18 + 1));
    break;
  case TYPE_INFOLOG:
    xml::Parser::appendDataStr(&this->m_xmlParser,(string *)(pIStack_18 + 1));
    break;
  case TYPE_KERNELSOURCE:
    xml::Parser::appendDataStr(&this->m_xmlParser,(string *)(pIStack_18 + 1));
  }
  return;
}

Assistant:

void TestResultParser::handleData (void)
{
	ri::Item*	curItem		= getCurrentItem();
	ri::Type	type		= curItem ? curItem->getType() : ri::TYPE_LAST;

	switch (type)
	{
		case ri::TYPE_RESULT:
			m_xmlParser.appendDataStr(static_cast<ri::Result*>(curItem)->details);
			break;

		case ri::TYPE_TEXT:
			m_xmlParser.appendDataStr(static_cast<ri::Text*>(curItem)->text);
			break;

		case ri::TYPE_SHADERSOURCE:
			m_xmlParser.appendDataStr(static_cast<ri::ShaderSource*>(curItem)->source);
			break;

		case ri::TYPE_SPIRVSOURCE:
			m_xmlParser.appendDataStr(static_cast<ri::SpirVSource*>(curItem)->source);
			break;

		case ri::TYPE_INFOLOG:
			m_xmlParser.appendDataStr(static_cast<ri::InfoLog*>(curItem)->log);
			break;

		case ri::TYPE_KERNELSOURCE:
			m_xmlParser.appendDataStr(static_cast<ri::KernelSource*>(curItem)->source);
			break;

		case ri::TYPE_NUMBER:
		case ri::TYPE_SAMPLEVALUE:
			m_xmlParser.appendDataStr(m_curNumValue);
			break;

		case ri::TYPE_IMAGE:
		{
			ri::Image* image = static_cast<ri::Image*>(curItem);

			// Base64 decode.
			int numBytesIn = m_xmlParser.getDataSize();

			for (int inNdx = 0; inNdx < numBytesIn; inNdx++)
			{
				deUint8		byte		= m_xmlParser.getDataByte(inNdx);
				deUint8		decodedBits	= 0;

				if (de::inRange<deInt8>(byte, 'A', 'Z'))
					decodedBits = (deUint8)(byte - 'A');
				else if (de::inRange<deInt8>(byte, 'a', 'z'))
					decodedBits = (deUint8)(('Z'-'A'+1) + (byte-'a'));
				else if (de::inRange<deInt8>(byte, '0', '9'))
					decodedBits = (deUint8)(('Z'-'A'+1) + ('z'-'a'+1) + (byte-'0'));
				else if (byte == '+')
					decodedBits = ('Z'-'A'+1) + ('z'-'a'+1) + ('9'-'0'+1);
				else if (byte == '/')
					decodedBits = ('Z'-'A'+1) + ('z'-'a'+1) + ('9'-'0'+2);
				else if (byte == '=')
				{
					// Padding at end - remove last byte.
					if (image->data.empty())
						throw TestResultParseError("Malformed base64 data");
					image->data.pop_back();
					continue;
				}
				else
					continue; // Not an B64 input character.

				int phase = m_base64DecodeOffset % 4;

				if (phase == 0)
					image->data.resize(image->data.size()+3, 0);

				if ((int)image->data.size() < (m_base64DecodeOffset>>2)*3 + 3)
					throw TestResultParseError("Malformed base64 data");
				deUint8* outPtr = &image->data[(m_base64DecodeOffset>>2)*3];

				switch (phase)
				{
					case 0: outPtr[0] |= (deUint8)(decodedBits<<2);													break;
					case 1: outPtr[0] |= (deUint8)(decodedBits>>4);	outPtr[1] |= (deUint8)((decodedBits&0xF)<<4);	break;
					case 2: outPtr[1] |= (deUint8)(decodedBits>>2);	outPtr[2] |= (deUint8)((decodedBits&0x3)<<6);	break;
					case 3: outPtr[2] |= decodedBits;																break;
					default:
						DE_ASSERT(false);
				}

				m_base64DecodeOffset += 1;
			}

			break;
		}

		default:
			// Just ignore data.
			break;
	}
}